

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O3

unique_lock<std::mutex> __thiscall pbrt::ThreadPool::AddToJobList(ThreadPool *this,ParallelJob *job)

{
  long lVar1;
  long in_RDX;
  undefined8 extraout_RDX;
  unique_lock<std::mutex> uVar2;
  
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&job->next;
  *(undefined1 *)
   &(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)this);
  *(undefined1 *)
   &(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = 1;
  lVar1 = *(long *)&job[1].removed;
  if (lVar1 != 0) {
    *(long *)(lVar1 + 0x10) = in_RDX;
  }
  *(long *)(in_RDX + 0x18) = lVar1;
  *(long *)&job[1].removed = in_RDX;
  std::condition_variable::notify_all();
  uVar2._8_8_ = extraout_RDX;
  uVar2._M_device = (mutex_type *)this;
  return uVar2;
}

Assistant:

std::unique_lock<std::mutex> ThreadPool::AddToJobList(ParallelJob *job) {
    std::unique_lock<std::mutex> lock(mutex);
    // Add _job_ to head of _jobList_
    if (jobList != nullptr)
        jobList->prev = job;
    job->next = jobList;
    jobList = job;

    jobListCondition.notify_all();
    return lock;
}